

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::segmentcheckReverse(string *unit,char closeSegment,int *index)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = *index;
  if ((int)uVar4 < (int)unit->_M_string_length) {
    while (-1 < (int)uVar4) {
      pcVar1 = (unit->_M_dataplus)._M_p;
      cVar2 = pcVar1[uVar4];
      uVar5 = uVar4 - 1;
      *index = uVar5;
      if ((uVar4 == 0) || (pcVar1[uVar5] != '\\')) {
        if (cVar2 == closeSegment) {
          return true;
        }
        if (((cVar2 == ')') || (cVar2 == ']')) || (cVar2 == '}')) {
          cVar2 = getMatchCharacter(cVar2);
          bVar3 = segmentcheckReverse(unit,cVar2,index);
          if (!bVar3) {
            return false;
          }
          uVar4 = *index;
        }
        else {
          if (cVar2 == '(') {
            return false;
          }
          if (cVar2 == '[') {
            return false;
          }
          uVar4 = uVar5;
          if (cVar2 == '{') {
            return false;
          }
        }
      }
      else {
        *index = uVar4 - 2;
        uVar4 = uVar4 - 2;
      }
    }
  }
  return false;
}

Assistant:

static bool
    segmentcheckReverse(const std::string& unit, char closeSegment, int& index)
{
    if (index >= static_cast<int>(unit.size())) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    while (index >= 0) {
        char current = unit[index];
        --index;
        if (index >= 0 && unit[index] == '\\') {
            --index;
            continue;
        }
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '}':
            case ')':
            case ']':
                if (!segmentcheckReverse(
                        unit, getMatchCharacter(current), index)) {
                    // LCOV_EXCL_START
                    return false;
                    // LCOV_EXCL_STOP
                }
                break;
            case '{':
            case '(':
            case '[':
                return false;
            default:
                break;
        }
    }
    // LCOV_EXCL_START
    return false;
    // LCOV_EXCL_STOP
}